

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O3

ReferenceCounterValueType __thiscall
Diligent::RefCountersImpl::ReleaseWeakRef(RefCountersImpl *this)

{
  int iVar1;
  atomic<int> *paVar2;
  int iVar3;
  char (*in_RCX) [34];
  ulong uVar4;
  string msg;
  unique_lock<Threading::SpinLock> Guard;
  string local_40;
  unique_lock<Threading::SpinLock> local_20;
  
  local_20._M_device = &this->m_Lock;
  local_20._M_owns = false;
  std::unique_lock<Threading::SpinLock>::lock(&local_20);
  local_20._M_owns = true;
  LOCK();
  paVar2 = &this->m_NumWeakReferences;
  iVar3 = (paVar2->super___atomic_base<int>)._M_i;
  (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  iVar1 = iVar3 + -1;
  if (iVar3 < 1) {
    FormatString<char[38]>(&local_40,(char (*) [38])"Inconsistent call to ReleaseWeakRef()");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"ReleaseWeakRef",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Common/interface/RefCountedObjectImpl.hpp"
               ,0x5e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) goto LAB_001be659;
    uVar4 = local_40.field_2._M_allocated_capacity + 1;
    this = (RefCountersImpl *)local_40._M_dataplus._M_p;
  }
  else {
    if ((iVar1 != 0) || ((this->m_ObjectState)._M_i != Destroyed)) goto LAB_001be659;
    if ((this->m_NumStrongReferences).super___atomic_base<int>._M_i != 0) {
      FormatString<char[26],char[34]>
                (&local_40,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_NumStrongReferences.load() == 0",in_RCX);
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"ReleaseWeakRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Common/interface/RefCountedObjectImpl.hpp"
                 ,0x8a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    if (this->m_ObjectWrapperBuffer[1] != 0 || this->m_ObjectWrapperBuffer[0] != 0) {
      FormatString<char[28]>(&local_40,(char (*) [28])"Object wrapper must be null");
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"ReleaseWeakRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Common/interface/RefCountedObjectImpl.hpp"
                 ,0x8b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    std::unique_lock<Threading::SpinLock>::unlock(&local_20);
    ~RefCountersImpl(this);
    uVar4 = 0x30;
  }
  operator_delete(this,uVar4);
LAB_001be659:
  std::unique_lock<Threading::SpinLock>::~unique_lock(&local_20);
  return iVar1;
}

Assistant:

inline virtual ReferenceCounterValueType ReleaseWeakRef() override final
    {
        // The method must be serialized!
        std::unique_lock<Threading::SpinLock> Guard{m_Lock};

        // It is essentially important to check the number of weak references
        // while holding the lock. Otherwise reference counters object
        // may be destroyed twice if ReleaseStrongRef() is executed by other
        // thread.
        const auto NumWeakReferences = m_NumWeakReferences.fetch_add(-1) - 1;
        VERIFY(NumWeakReferences >= 0, "Inconsistent call to ReleaseWeakRef()");

        // There are two special case when we must not destroy the ref counters object even
        // when NumWeakReferences == 0 && m_NumStrongReferences == 0 :
        //
        //             This thread             |    Another thread - ReleaseStrongRef()
        //                                     |
        // 1. Lock the object                  |
        //                                     |
        // 2. Decrement m_NumWeakReferences,   |   1. Decrement m_NumStrongReferences,
        //    m_NumWeakReferences==0           |      RefCount == 0
        //                                     |
        //                                     |   2. Start waiting for the lock to destroy
        //                                     |      the object, m_ObjectState != ObjectState::Destroyed
        // 3. Do not destroy reference         |
        //    counters, unlock                 |
        //                                     |   3. Acquire the lock,
        //                                     |      destroy the object,
        //                                     |      read m_NumWeakReferences==0
        //                                     |      destroy the reference counters
        //

        // If an exception is thrown during the object construction and there is a weak pointer to the object itself,
        // we may get to this point, but should not destroy the reference counters, because it will be destroyed by MakeNewRCObj
        // Consider this example:
        //
        //   A ==sp==> B ---wp---> A
        //
        //   MakeNewRCObj::operator()
        //    try
        //    {
        //     A.ctor()
        //       B.ctor()
        //        wp.ctor m_NumWeakReferences==1
        //        throw
        //        wp.dtor m_NumWeakReferences==0, destroy this
        //    }
        //    catch(...)
        //    {
        //       Destroy ref counters second time
        //    }
        //
        if (NumWeakReferences == 0 && /*m_NumStrongReferences == 0 &&*/ m_ObjectState.load() == ObjectState::Destroyed)
        {
            VERIFY_EXPR(m_NumStrongReferences.load() == 0);
            VERIFY(m_ObjectWrapperBuffer[0] == 0 && m_ObjectWrapperBuffer[1] == 0, "Object wrapper must be null");
            // m_ObjectState is set to ObjectState::Destroyed under the lock. If the state is not Destroyed,
            // ReleaseStrongRef() will take care of it.
            // Access to Object wrapper and decrementing m_NumWeakReferences is atomic. Since we acquired the lock,
            // no other thread can access either of them.
            // Access to m_NumStrongReferences is NOT PROTECTED by lock.

            // There are no more references to the ref counters object and the object itself
            // is already destroyed.
            // We can safely unlock it and destroy.
            // If we do not unlock it, this->m_LockFlag will expire,
            // which will cause Lock.~LockHelper() to crash.
            Guard.unlock();
            SelfDestroy();
        }
        return NumWeakReferences;
    }